

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetCenterMarkSize(ON_Annotation *this,ON_DimStyle *parent_style,double size)

{
  bool bCreateIfNull;
  ON_DimStyle *pOVar1;
  double candidate_value;
  ON_DimStyle *override_style;
  bool bCreate;
  double size_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  candidate_value = ON_DimStyle::CenterMark(pOVar1);
  bCreateIfNull = Internal_DimStyleDoubleChanged(size,candidate_value);
  pOVar1 = Internal_GetOverrideStyle(this,bCreateIfNull);
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetCenterMark(pOVar1,size);
    ON_DimStyle::SetFieldOverride(pOVar1,Centermark,bCreateIfNull);
  }
  return;
}

Assistant:

void ON_Annotation::SetCenterMarkSize(const ON_DimStyle* parent_style, double size)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(size, parent_style->CenterMark());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetCenterMark(size);
    override_style->SetFieldOverride(ON_DimStyle::field::Centermark, bCreate);
  }
}